

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O3

void helicsMessageReserve(HelicsMessage message,int reservedSize,HelicsError *err)

{
  if (err == (HelicsError *)0x0) {
    if (message == (HelicsMessage)0x0) {
      return;
    }
    if (*(short *)((long)message + 10) != 0xb3) {
      return;
    }
  }
  else {
    if (err->error_code != 0) {
      return;
    }
    if ((message == (HelicsMessage)0x0) || (*(short *)((long)message + 10) != 0xb3)) {
      err->error_code = -4;
      err->message = "The message object was not valid";
      return;
    }
  }
  helics::SmallBuffer::reserve((SmallBuffer *)((long)message + 0x10),(long)reservedSize);
  return;
}

Assistant:

void helicsMessageReserve(HelicsMessage message, int reservedSize, HelicsError* err)
{
    auto* mess = getMessageObj(message, err);
    if (mess == nullptr) {
        return;
    }
    try {
        mess->data.reserve(reservedSize);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}